

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pairwise_tests.cpp
# Opt level: O2

int iu_PairwiseTest_x_iutest_x_Num_Test::AddRegister(void)

{
  int iVar1;
  UnitTest *pUVar2;
  ParamTestSuiteInfo<PairwiseTest> *this;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  if (AddRegister()::testinfo == '\0') {
    iVar1 = __cxa_guard_acquire(&AddRegister()::testinfo);
    if (iVar1 != 0) {
      iutest::detail::ParamTestInstance<iu_PairwiseTest_x_iutest_x_Num_Test>::ParamTestInstance
                (&AddRegister::testinfo,"Num");
      __cxa_atexit(iutest::detail::IParamTestInfoData::~IParamTestInfoData,&AddRegister::testinfo,
                   &__dso_handle);
      __cxa_guard_release(&AddRegister()::testinfo);
    }
  }
  pUVar2 = iutest::UnitTest::instance();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"PairwiseTest",&local_49);
  iutest::detail::package_name_server<iuTest_TestSuitePackage>::getname_abi_cxx11_();
  this = iutest::detail::ParamTestSuiteHolder::GetTestSuitePatternHolder<PairwiseTest>
                   (&pUVar2->m_param_testsuite_holder,&local_28,&local_48);
  iutest::detail::IParamTestSuiteInfo::AddTestPattern
            (&this->super_IParamTestSuiteInfo,&AddRegister::testinfo.super_IParamTestInfoData);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

IUTEST_P(PairwiseTest, Num)
{
#ifndef USE_PROGRESS
    PairwiseTestTuple param = GetParam();
    printf("%d %d %d %d %d %d %d %d %d\n"
        , ::iutest::tuples::get<0>(param)
        , ::iutest::tuples::get<1>(param)
        , ::iutest::tuples::get<2>(param)
        , ::iutest::tuples::get<3>(param)
        , ::iutest::tuples::get<4>(param)
        , ::iutest::tuples::get<5>(param)
        , ::iutest::tuples::get<6>(param)
        , ::iutest::tuples::get<7>(param)
        , ::iutest::tuples::get<8>(param)
    );
#endif
}